

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O2

void __thiscall cfd::api::json::DecodePsbtInput::~DecodePsbtInput(DecodePsbtInput *this)

{
  (this->super_JsonClassBase<cfd::api::json::DecodePsbtInput>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodePsbtInput_00655bb0;
  std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>::~vector
            (&(this->unknown_).super_JsonVector<cfd::api::json::PsbtMapData>.
              super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
            );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->final_scriptwitness_).
             super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  DecodeUnlockingScript::~DecodeUnlockingScript(&this->final_scriptsig_);
  std::vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>::
  ~vector(&(this->bip32_derivs_).super_JsonVector<cfd::api::json::PsbtBip32Data>.
           super_vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
         );
  PsbtScriptData::~PsbtScriptData(&this->witness_script_);
  PsbtScriptData::~PsbtScriptData(&this->redeem_script_);
  std::__cxx11::string::~string((string *)&this->sighash_);
  std::vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
  ::~vector(&(this->partial_signatures_).super_JsonVector<cfd::api::json::PsbtSignatureData>.
             super_vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
           );
  DecodePsbtUtxo::~DecodePsbtUtxo(&this->witness_utxo_);
  DecodeRawTransactionResponse::~DecodeRawTransactionResponse(&this->non_witness_utxo_);
  std::__cxx11::string::~string((string *)&this->non_witness_utxo_hex_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->ignore_items)._M_t);
  return;
}

Assistant:

virtual ~DecodePsbtInput() {
    // do nothing
  }